

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O3

int __thiscall
TestConfigExDataIndex::anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this)

{
  int iVar1;
  
  iVar1 = SSL_get_ex_new_index(0,(void *)0x0,(undefined1 *)0x0,(undefined1 *)0x0,(undefined1 *)0x0);
  if (-1 < iVar1) {
    return iVar1;
  }
  abort();
}

Assistant:

static int TestConfigExDataIndex() {
  static int index = [&] {
    OPENSSL_disable_malloc_failures_for_testing();
    int ret = SSL_get_ex_new_index(0, nullptr, nullptr, nullptr, nullptr);
    BSSL_CHECK(ret >= 0);
    OPENSSL_enable_malloc_failures_for_testing();
    return ret;
  }();
  return index;
}